

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void do_cmd_options_item(char *title,wchar_t row)

{
  uint32_t *puVar1;
  menu menu;
  menu local_c0;
  
  menu_init(&local_c0,MN_SKIN_SCROLL,&options_item_iter);
  menu_setpriv(&local_c0,0x15,(void *)0x0);
  local_c0.title = title;
  menu_layout(&local_c0,&SCREEN_REGION);
  screen_save();
  clear_from(L'\0');
  menu_select(&local_c0,0,false);
  screen_load();
  puVar1 = &player->upkeep->notice;
  *puVar1 = *puVar1 | 2;
  return;
}

Assistant:

void do_cmd_options_item(const char *title, int row)
{
	struct menu menu;

	menu_init(&menu, MN_SKIN_SCROLL, &options_item_iter);
	menu_setpriv(&menu, N_ELEMENTS(sval_dependent) +
				 N_ELEMENTS(extra_item_options) + 1, NULL);

	menu.title = title;
	menu_layout(&menu, &SCREEN_REGION);

	screen_save();
	clear_from(0);
	menu_select(&menu, 0, false);
	screen_load();

	player->upkeep->notice |= PN_IGNORE;

	return;
}